

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Status __thiscall leveldb::DBImpl::NewDB(DBImpl *this)

{
  bool bVar1;
  int iVar2;
  Comparator *pCVar3;
  undefined4 extraout_var;
  DBImpl *in_RSI;
  Status local_180;
  Status local_178;
  Status local_170;
  Slice local_168;
  undefined1 local_158 [16];
  string record;
  undefined1 local_130 [8];
  Writer log;
  WritableFile *local_108;
  WritableFile *file;
  string manifest;
  Slice local_d0;
  undefined1 local_c0 [8];
  VersionEdit new_db;
  DBImpl *this_local;
  Status *s;
  
  VersionEdit::VersionEdit((VersionEdit *)local_c0);
  pCVar3 = user_comparator(in_RSI);
  iVar2 = (*pCVar3->_vptr_Comparator[3])();
  Slice::Slice(&local_d0,(char *)CONCAT44(extraout_var,iVar2));
  VersionEdit::SetComparatorName((VersionEdit *)local_c0,&local_d0);
  VersionEdit::SetLogNumber((VersionEdit *)local_c0,0);
  VersionEdit::SetNextFile((VersionEdit *)local_c0,2);
  VersionEdit::SetLastSequence((VersionEdit *)local_c0,0);
  DescriptorFileName((leveldb *)&file,&in_RSI->dbname_,1);
  log.type_crc_[4]._3_1_ = 0;
  (*in_RSI->env_->_vptr_Env[4])(this,in_RSI->env_,&file,&local_108);
  bVar1 = Status::ok((Status *)this);
  if (bVar1) {
    leveldb::log::Writer::Writer((Writer *)local_130,local_108);
    std::__cxx11::string::string((string *)(local_158 + 8));
    VersionEdit::EncodeTo((VersionEdit *)local_c0,(string *)(local_158 + 8));
    Slice::Slice(&local_168,(string *)(local_158 + 8));
    leveldb::log::Writer::AddRecord((Writer *)local_158,(Slice *)local_130);
    Status::operator=((Status *)this,(Status *)local_158);
    Status::~Status((Status *)local_158);
    bVar1 = Status::ok((Status *)this);
    if (bVar1) {
      (*local_108->_vptr_WritableFile[3])(&local_170);
      Status::operator=((Status *)this,&local_170);
      Status::~Status(&local_170);
    }
    std::__cxx11::string::~string((string *)(local_158 + 8));
    leveldb::log::Writer::~Writer((Writer *)local_130);
    if (local_108 != (WritableFile *)0x0) {
      (*local_108->_vptr_WritableFile[1])();
    }
    bVar1 = Status::ok((Status *)this);
    if (bVar1) {
      SetCurrentFile((leveldb *)&local_178,in_RSI->env_,&in_RSI->dbname_,1);
      Status::operator=((Status *)this,&local_178);
      Status::~Status(&local_178);
    }
    else {
      (*in_RSI->env_->_vptr_Env[8])(&local_180,in_RSI->env_,&file);
      Status::~Status(&local_180);
    }
  }
  log.type_crc_[4]._3_1_ = 1;
  log.type_crc_[3] = 1;
  std::__cxx11::string::~string((string *)&file);
  VersionEdit::~VersionEdit((VersionEdit *)local_c0);
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::NewDB() {
  VersionEdit new_db;
  new_db.SetComparatorName(user_comparator()->Name());
  new_db.SetLogNumber(0);
  new_db.SetNextFile(2);
  new_db.SetLastSequence(0);

  const std::string manifest = DescriptorFileName(dbname_, 1);
  WritableFile* file;
  Status s = env_->NewWritableFile(manifest, &file);
  if (!s.ok()) {
    return s;
  }
  {
    log::Writer log(file);
    std::string record;
    new_db.EncodeTo(&record);
    s = log.AddRecord(record);
    if (s.ok()) {
      s = file->Close();
    }
  }
  delete file;
  if (s.ok()) {
    // Make "CURRENT" file that points to the new manifest file.
    s = SetCurrentFile(env_, dbname_, 1);
  } else {
    env_->DeleteFile(manifest);
  }
  return s;
}